

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc64ad.c
# Opt level: O2

int_t mc64ed_(int_t *qlen,int_t *n,int_t *q,double *d__,int_t *l,int_t *iway)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  
  iVar2 = q[(long)*qlen + -1];
  dVar1 = d__[(long)iVar2 + -1];
  *qlen = *qlen + -1;
  iVar6 = 0;
  if (0 < *n) {
    iVar6 = *n;
  }
  if (*iway == 1) {
    uVar4 = 1;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      uVar5 = uVar4 * 2;
      if (*qlen < (int)uVar5) break;
      dVar8 = d__[(long)q[(long)(int)uVar5 + -1] + -1];
      if ((int)uVar5 < *qlen) {
        if (dVar8 < d__[(long)q[(long)(int)(uVar5 | 1) + -1] + -1]) {
          dVar8 = d__[(long)q[(long)(int)(uVar5 | 1) + -1] + -1];
          uVar5 = uVar5 | 1;
        }
      }
      if (dVar8 <= dVar1) break;
      iVar3 = q[(long)(int)uVar5 + -1];
      q[(long)(int)uVar4 + -1] = iVar3;
      l[(long)iVar3 + -1] = uVar4;
      uVar4 = uVar5;
    }
  }
  else {
    uVar4 = 1;
    while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
      uVar5 = uVar4 * 2;
      if (*qlen < (int)uVar5) break;
      dVar8 = d__[(long)q[(long)(int)uVar5 + -1] + -1];
      if ((int)uVar5 < *qlen) {
        if (d__[(long)q[(long)(int)(uVar5 | 1) + -1] + -1] < dVar8) {
          dVar8 = d__[(long)q[(long)(int)(uVar5 | 1) + -1] + -1];
          uVar5 = uVar5 | 1;
        }
      }
      if (dVar1 <= dVar8) break;
      iVar3 = q[(long)(int)uVar5 + -1];
      q[(long)(int)uVar4 + -1] = iVar3;
      l[(long)iVar3 + -1] = uVar4;
      uVar4 = uVar5;
    }
  }
  q[(long)(int)uVar4 + -1] = iVar2;
  l[(long)iVar2 + -1] = uVar4;
  return 0;
}

Assistant:

int_t mc64ed_(int_t *qlen, int_t *n, int_t *q, 
	double *d__, int_t *l, int_t *iway)
{
    /* System generated locals */
    int_t i__1;

    /* Local variables */
    int_t i__;
    double di, dk, dr;
    int_t pos, idum, posk;


/* *** Copyright (c) 1999  Council for the Central Laboratory of the */
/*     Research Councils                                             *** */
/* *** Although every effort has been made to ensure robustness and  *** */
/* *** reliability of the subroutines in this MC64 suite, we         *** */
/* *** disclaim any liability arising through the use or misuse of   *** */
/* *** any of the subroutines.                                       *** */
/* *** Any problems?   Contact ... */
/*     Iain Duff (I.Duff@rl.ac.uk) or Jacko Koster (jak@ii.uib.no)   *** */

/* Variables QLEN,N,Q,D,L are described in MC64B/BD (IWAY = 1) or */
/*     MC64W/WD (IWAY = 2) */
/* The root node is deleted from the binary heap. */
/* Local variables and parameters */
/* Move last element to begin of Q */
    /* Parameter adjustments */
    --l;
    --d__;
    --q;

    /* Function Body */
    i__ = q[*qlen];
    di = d__[i__];
    --(*qlen);
    pos = 1;
    if (*iway == 1) {
	i__1 = *n;
	for (idum = 1; idum <= i__1; ++idum) {
	    posk = pos << 1;
	    if (posk > *qlen) {
		goto L20;
	    }
	    dk = d__[q[posk]];
	    if (posk < *qlen) {
		dr = d__[q[posk + 1]];
		if (dk < dr) {
		    ++posk;
		    dk = dr;
		}
	    }
	    if (di >= dk) {
		goto L20;
	    }
/* Exchange old last element with larger priority child */
	    q[pos] = q[posk];
	    l[q[pos]] = pos;
	    pos = posk;
/* L10: */
	}
/* End of dummy loop; this point is never reached */
    } else {
	i__1 = *n;
	for (idum = 1; idum <= i__1; ++idum) {
	    posk = pos << 1;
	    if (posk > *qlen) {
		goto L20;
	    }
	    dk = d__[q[posk]];
	    if (posk < *qlen) {
		dr = d__[q[posk + 1]];
		if (dk > dr) {
		    ++posk;
		    dk = dr;
		}
	    }
	    if (di <= dk) {
		goto L20;
	    }
/* Exchange old last element with smaller child */
	    q[pos] = q[posk];
	    l[q[pos]] = pos;
	    pos = posk;
/* L15: */
	}
/* End of dummy loop; this point is never reached */
    }
/* End of dummy if; this point is never reached */
L20:
    q[pos] = i__;
    l[i__] = pos;
    return 0;
}